

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O1

void compute_band_corr(float *bandE,kiss_fft_cpx *X,kiss_fft_cpx *P)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_68 [4];
  float sum [22];
  
  sum[0xc] = 0.0;
  sum[0xd] = 0.0;
  sum[0xe] = 0.0;
  sum[0xf] = 0.0;
  sum[8] = 0.0;
  sum[9] = 0.0;
  sum[10] = 0.0;
  sum[0xb] = 0.0;
  sum[4] = 0.0;
  sum[5] = 0.0;
  sum[6] = 0.0;
  sum[7] = 0.0;
  sum[0] = 0.0;
  sum[1] = 0.0;
  sum[2] = 0.0;
  sum[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  sum[0x10] = 0.0;
  sum[0x11] = 0.0;
  lVar3 = 0;
  do {
    lVar2 = lVar3 + 1;
    iVar7 = (int)eband5ms[lVar3];
    iVar5 = eband5ms[lVar3 + 1] - iVar7;
    if (iVar5 != 0 && iVar7 <= eband5ms[lVar3 + 1]) {
      lVar8 = (long)iVar7;
      uVar6 = iVar5 * 4;
      fVar11 = local_68[lVar3];
      fVar10 = local_68[lVar2];
      uVar1 = uVar6;
      if ((int)uVar6 < 2) {
        uVar1 = 1;
      }
      uVar9 = 0;
      do {
        fVar12 = (float)(int)uVar9 / (float)(int)uVar6;
        fVar13 = X[lVar8 * 4 + uVar9].i * P[lVar8 * 4 + uVar9].i +
                 X[lVar8 * 4 + uVar9].r * P[lVar8 * 4 + uVar9].r;
        fVar11 = fVar11 + (1.0 - fVar12) * fVar13;
        fVar10 = fVar10 + fVar13 * fVar12;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      local_68[lVar3] = fVar11;
      local_68[lVar2] = fVar10;
    }
    lVar3 = lVar2;
  } while (lVar2 != 0x15);
  local_68[0] = local_68[0] + local_68[0];
  sum[0x11] = sum[0x11] + sum[0x11];
  pfVar4 = local_68;
  for (lVar3 = 0x16; lVar3 != 0; lVar3 = lVar3 + -1) {
    *bandE = *pfVar4;
    pfVar4 = pfVar4 + 1;
    bandE = bandE + 1;
  }
  return;
}

Assistant:

void compute_band_corr(float *bandE, const kiss_fft_cpx *X, const kiss_fft_cpx *P) {
    int i;
    float sum[NB_BANDS] = {0};
    for (i = 0; i < NB_BANDS - 1; i++) {
        int j;
        int band_size;
        band_size = (eband5ms[i + 1] - eband5ms[i]) << FRAME_SIZE_SHIFT;
        for (j = 0; j < band_size; j++) {
            float tmp;
            float frac = (float) j / band_size;
            tmp = X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r;
            tmp += X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i;
            sum[i] += (1 - frac) * tmp;
            sum[i + 1] += frac * tmp;
        }
    }
    sum[0] *= 2;
    sum[NB_BANDS - 1] *= 2;
    for (i = 0; i < NB_BANDS; i++) {
        bandE[i] = sum[i];
    }
}